

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Text::spliceLine(Text *this,size_t _indent,string *_remainder,size_t _pos)

{
  string local_c0 [32];
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  size_t local_28;
  size_t _pos_local;
  string *_remainder_local;
  size_t _indent_local;
  Text *this_local;
  
  local_28 = _pos;
  _pos_local = (size_t)_remainder;
  _remainder_local = (string *)_indent;
  _indent_local = (size_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,_indent,' ',&local_69);
  std::__cxx11::string::substr((ulong)local_a0,_pos_local);
  std::operator+(local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->lines,local_48);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::substr((ulong)local_c0,_pos_local);
  std::__cxx11::string::operator=((string *)_pos_local,local_c0);
  std::__cxx11::string::~string(local_c0);
  return;
}

Assistant:

void Text::spliceLine( std::size_t _indent, std::string& _remainder, std::size_t _pos ) {
        lines.push_back( std::string( _indent, ' ' ) + _remainder.substr( 0, _pos ) );
        _remainder = _remainder.substr( _pos );
    }